

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::VerifyMark
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this)

{
  FBVEnumerator *this_00;
  HeapBlockType HVar1;
  ushort uVar2;
  SmallHeapBlockBitVector *iterStart;
  Recycler *this_01;
  code *pcVar3;
  bool bVar4;
  BOOLEAN BVar5;
  ushort uVar6;
  BVIndex i;
  undefined4 *puVar7;
  SmallHeapBlockBitVector *this_02;
  byte *pbVar8;
  char *objectAddress;
  uint uVar9;
  undefined1 local_178 [8];
  SmallHeapBlockBitVector tempFreeBits;
  FBVEnumerator _bvenum;
  
  if ((this->super_HeapBlock).needOOMRescan == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x3e4,"(!this->needOOMRescan)","!this->needOOMRescan");
    if (!bVar4) {
LAB_006af241:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  iterStart = this->markBits;
  memset((SmallHeapBlockBitVector *)local_178,0,0x100);
  BuildFreeBitVector(this,(SmallHeapBlockBitVector *)local_178);
  this_02 = GetInvalidBitVector(this);
  uVar2 = this->objectSize;
  this_01 = this->heapBucket->heapInfo->recycler;
  JsUtil::FBVEnumerator::FBVEnumerator
            ((FBVEnumerator *)(tempFreeBits.data + 0x1f),iterStart->data,iterStart[1].data);
  bVar4 = JsUtil::FBVEnumerator::End((FBVEnumerator *)(tempFreeBits.data + 0x1f));
  if (!bVar4) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    this_00 = (FBVEnumerator *)(tempFreeBits.data + 0x1f);
    do {
      i = JsUtil::FBVEnumerator::GetCurrent(this_00);
      BVar5 = BVStatic<2048UL>::Test((BVStatic<2048UL> *)local_178,i);
      if ((BVar5 != '\0') || (BVar5 = BVStatic<2048UL>::Test(this_02,i), BVar5 != '\0'))
      goto LAB_006aeffa;
      bVar4 = IsValidBitIndex(this,i);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x3f2,"(IsValidBitIndex(bitIndex))","IsValidBitIndex(bitIndex)");
        if (!bVar4) goto LAB_006af241;
        *puVar7 = 0;
      }
      if ((i & 0xf800) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                           ,0x25d,"(bitIndex <= TBlockAttributes::MaxAddressBit)",
                           "bitIndex <= TBlockAttributes::MaxAddressBit");
        if (!bVar4) goto LAB_006af241;
        *puVar7 = 0;
      }
      uVar6 = ValidPointers<MediumAllocationBlockAttributes>::GetAddressIndex
                        (&this->validPointers,i & 0xffff);
      if (0x800 < (ushort)(uVar6 + 1)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                           ,0x261,
                           "(objectIndex == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit || objectIndex <= TBlockAttributes::MaxAddressBit)"
                           ,
                           "objectIndex == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit || objectIndex <= TBlockAttributes::MaxAddressBit"
                          );
        if (!bVar4) goto LAB_006af241;
        *puVar7 = 0;
      }
      uVar9 = (uint)uVar6;
      pbVar8 = ObjectInfo(this,uVar9);
      if ((*pbVar8 & 4) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x3f5,"((this->ObjectInfo(objectIndex) & NewTrackBit) == 0)",
                           "(this->ObjectInfo(objectIndex) & NewTrackBit) == 0");
        if (!bVar4) goto LAB_006af241;
        *puVar7 = 0;
      }
      HVar1 = (this->super_HeapBlock).heapBlockType;
      if (HVar1 < 0xb) {
        if ((0x630U >> (HVar1 & 0x1f) & 1) == 0) {
          if ((0x84U >> (HVar1 & 0x1f) & 1) == 0) goto LAB_006af1ac;
        }
        else if (DAT_015bf41e == '\x01') goto LAB_006af1ac;
      }
      else {
LAB_006af1ac:
        pbVar8 = ObjectInfo(this,uVar9);
        if ((*pbVar8 & 0x20) == 0 && 7 < uVar2) {
          objectAddress = (this->super_HeapBlock).address + this->objectSize * uVar9;
          uVar9 = (uint)(uVar2 >> 3);
          do {
            bVar4 = Recycler::VerifyMark(this_01,objectAddress,*(void **)objectAddress);
            if (((bVar4) && (DAT_015bf41e == '\x01')) && (DAT_015bf41f == '\x01')) {
              (*(this->super_HeapBlock)._vptr_HeapBlock[3])(this);
            }
            objectAddress = objectAddress + 8;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
        }
      }
LAB_006aeffa:
      JsUtil::FBVEnumerator::operator++(this_00,0);
      bVar4 = JsUtil::FBVEnumerator::End(this_00);
    } while (!bVar4);
  }
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::VerifyMark()
{
    Assert(!this->needOOMRescan);

    SmallHeapBlockBitVector * marked = this->GetMarkedBitVector();
    SmallHeapBlockBitVector tempFreeBits;
    this->BuildFreeBitVector(&tempFreeBits);
    SmallHeapBlockBitVector * free = &tempFreeBits;
    SmallHeapBlockBitVector const * invalid = this->GetInvalidBitVector();
    uint objectWordCount = this->GetObjectWordCount();
    Recycler * recycler = this->heapBucket->heapInfo->recycler;

    FOREACH_BITSET_IN_FIXEDBV(bitIndex, marked)
    {
        if (!free->Test(bitIndex) && !invalid->Test(bitIndex))
        {
            Assert(IsValidBitIndex(bitIndex));
            uint objectIndex = GetObjectIndexFromBitIndex((ushort)bitIndex);

            Assert((this->ObjectInfo(objectIndex) & NewTrackBit) == 0);

            // NOTE: We can't verify mark for software write barrier blocks, because they may have
            // non-pointer updates that don't trigger the write barrier, but still look like a false reference.
            // Thus, when we get here, we'll see a false reference that isn't marked.
            // Since this situation is hard to detect, just don't verify mark for write barrier blocks.
            // We could fix this if we had object layout info.

            if (!this->IsLeafBlock()
#ifdef RECYCLER_WRITE_BARRIER
                && (!this->IsWithBarrier() || CONFIG_FLAG(ForceSoftwareWriteBarrier))
#endif
                )
            {
                if ((ObjectInfo(objectIndex) & LeafBit) == 0)
                {
                    char * objectAddress = this->address + objectIndex * objectSize;
                    for (uint i = 0; i < objectWordCount; i++)
                    {
                        void* target = *(void**) objectAddress;
                        if (recycler->VerifyMark(objectAddress, target))
                        {
#if DBG && GLOBAL_ENABLE_WRITE_BARRIER
                            if (CONFIG_FLAG(ForceSoftwareWriteBarrier) && CONFIG_FLAG(VerifyBarrierBit))
                            {
                                this->WBVerifyBitIsSet(objectAddress);
                            }
#endif
                        }

                        objectAddress += sizeof(void *);
                    }
                }
            }
        }
    }
    NEXT_BITSET_IN_FIXEDBV;
}